

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O2

Result __thiscall
wabt::ReadFile(wabt *this,string_view filename,
              vector<unsigned_char,_std::allocator<unsigned_char>_> *out_data)

{
  pointer puVar1;
  pointer puVar2;
  basic_string_view<char,_std::char_traits<char>_> __x;
  FILE *__stream;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  FILE *pFVar6;
  size_type __new_size;
  int *piVar7;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  Enum EVar8;
  char *pcVar9;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  string filename_str;
  string_view filename_local;
  stat statbuf;
  
  this_00 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)filename._M_str;
  filename_local._M_str = (char *)filename._M_len;
  filename_local._M_len = (size_t)this;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&filename_str,&filename_local,(allocator<char> *)&statbuf);
  __x._M_str = filename_local._M_str;
  __x._M_len = filename_local._M_len;
  __y._M_str = "-";
  __y._M_len = 1;
  bVar3 = std::operator==(__x,__y);
  if (bVar3) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(this_00,0);
    while( true ) {
      sVar5 = fread(&statbuf,1,0x1000,_stdin);
      if (sVar5 == 0) break;
      puVar1 = (this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      puVar2 = (this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (this_00,(size_type)(puVar1 + (sVar5 - (long)puVar2)));
      memcpy(puVar1 + ((long)(this_00->
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                             _M_impl.super__Vector_impl_data._M_start - (long)puVar2),&statbuf,sVar5
            );
    }
    iVar4 = ferror(_stdin);
    pFVar6 = _stderr;
    EVar8 = Ok;
    if (iVar4 == 0) goto LAB_0011e33f;
    piVar7 = __errno_location();
    filename_str._M_dataplus._M_p = strerror(*piVar7);
    pcVar9 = "error reading from stdin: %s\n";
LAB_0011e30d:
    fprintf(pFVar6,pcVar9,filename_str._M_dataplus._M_p);
  }
  else {
    iVar4 = stat(filename_str._M_dataplus._M_p,(stat *)&statbuf);
    if (iVar4 < 0) {
LAB_0011e2ca:
      pFVar6 = _stderr;
      piVar7 = __errno_location();
      pcVar9 = strerror(*piVar7);
      fprintf(pFVar6,"%s: %s\n",filename_str._M_dataplus._M_p,pcVar9);
    }
    else {
      if ((statbuf.st_mode._1_1_ & 0x80) == 0) {
        pcVar9 = "%s: not a regular file\n";
        pFVar6 = _stderr;
        goto LAB_0011e30d;
      }
      pFVar6 = fopen(filename_str._M_dataplus._M_p,"rb");
      if (pFVar6 == (FILE *)0x0) goto LAB_0011e2ca;
      iVar4 = fseek(pFVar6,0,2);
      if (iVar4 < 0) {
        pcVar9 = "fseek to end failed";
LAB_0011e32f:
        perror(pcVar9);
      }
      else {
        __new_size = ftell(pFVar6);
        if ((long)__new_size < 0) {
          pcVar9 = "ftell failed";
          goto LAB_0011e32f;
        }
        iVar4 = fseek(pFVar6,0,0);
        if (iVar4 < 0) {
          pcVar9 = "fseek to beginning failed";
          goto LAB_0011e32f;
        }
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(this_00,__new_size);
        if (__new_size == 0) {
LAB_0011e283:
          fclose(pFVar6);
          EVar8 = Ok;
          goto LAB_0011e33f;
        }
        sVar5 = fread((this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_start,__new_size,1,pFVar6);
        __stream = _stderr;
        if (sVar5 == 1) goto LAB_0011e283;
        piVar7 = __errno_location();
        pcVar9 = strerror(*piVar7);
        fprintf(__stream,"%s: fread failed: %s\n",filename_str._M_dataplus._M_p,pcVar9);
      }
      fclose(pFVar6);
    }
  }
  EVar8 = Error;
LAB_0011e33f:
  std::__cxx11::string::_M_dispose();
  return (Result)EVar8;
}

Assistant:

Result ReadFile(std::string_view filename, std::vector<uint8_t>* out_data) {
  std::string filename_str(filename);
  const char* filename_cstr = filename_str.c_str();

  if (filename == "-") {
    return ReadStdin(out_data);
  }

  struct stat statbuf;
  if (stat(filename_cstr, &statbuf) < 0) {
    fprintf(stderr, "%s: %s\n", filename_cstr, strerror(errno));
    return Result::Error;
  }

  if (!(statbuf.st_mode & S_IFREG)) {
    fprintf(stderr, "%s: not a regular file\n", filename_cstr);
    return Result::Error;
  }

  FILE* infile = fopen(filename_cstr, "rb");
  if (!infile) {
    fprintf(stderr, "%s: %s\n", filename_cstr, strerror(errno));
    return Result::Error;
  }

  if (fseek(infile, 0, SEEK_END) < 0) {
    perror("fseek to end failed");
    fclose(infile);
    return Result::Error;
  }

  long size = ftell(infile);
  if (size < 0) {
    perror("ftell failed");
    fclose(infile);
    return Result::Error;
  }

  if (fseek(infile, 0, SEEK_SET) < 0) {
    perror("fseek to beginning failed");
    fclose(infile);
    return Result::Error;
  }

  out_data->resize(size);
  if (size != 0 && fread(out_data->data(), size, 1, infile) != 1) {
    fprintf(stderr, "%s: fread failed: %s\n", filename_cstr, strerror(errno));
    fclose(infile);
    return Result::Error;
  }

  fclose(infile);
  return Result::Ok;
}